

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O2

uint Fxu_PairHashKeyArray(Fxu_Matrix *p,int *piVarsC1,int *piVarsC2,int nVarsC1,int nVarsC2)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)nVarsC1;
  if (nVarsC1 < 1) {
    uVar2 = uVar3;
  }
  uVar1 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = uVar1 ^ piVarsC1[uVar3] * s_Primes[uVar3 + 100];
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)nVarsC2;
  if (nVarsC2 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = uVar1 ^ piVarsC2[uVar3] * s_Primes[uVar3 + 200];
  }
  return uVar1;
}

Assistant:

unsigned Fxu_PairHashKeyArray( Fxu_Matrix * p, int piVarsC1[], int piVarsC2[], int nVarsC1, int nVarsC2 )
{
	int Offset1 = 100, Offset2 = 200, i;
	unsigned Key;
	// compute the hash key
	Key = 0;
    for ( i = 0; i < nVarsC1; i++ )
    	Key ^= s_Primes[Offset1+i] * piVarsC1[i];
    for ( i = 0; i < nVarsC2; i++ )
    	Key ^= s_Primes[Offset2+i] * piVarsC2[i];
	return Key;
}